

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

AstNode * parse_function_call(ParserState *parser,StringObject *methodname,int line)

{
  _Bool *p_Var1;
  AstNodeList **self;
  uint uVar2;
  int iVar3;
  LexerState *ls;
  C_MemoryAllocator *pCVar4;
  AstNode *pAVar5;
  AstNode *ptr;
  undefined4 *ptr_00;
  _Bool in_table_constructor;
  
  ls = parser->ls;
  pCVar4 = parser->compiler_state->allocator;
  uVar2 = ls->lastline;
  pAVar5 = (AstNode *)(*pCVar4->calloc)(pCVar4->arena,1,0x50);
  pAVar5->type = EXPR_FUNCTION_CALL;
  pAVar5->line_number = uVar2;
  p_Var1 = &(pAVar5->field_2).embedded_C_stmt.is_decl;
  *p_Var1 = (_Bool)(*p_Var1 & 0xfe);
  (pAVar5->field_2).function_call_expr.method_name = methodname;
  self = &(pAVar5->field_2).for_stmt.for_statement_list;
  (pAVar5->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  (pAVar5->field_2).function_call_expr.num_results = 1;
  (pAVar5->field_2).common_expr.type.type_code = RAVI_TANY;
  (pAVar5->field_2).goto_stmt.name = (StringObject *)0x0;
  iVar3 = (ls->t).token;
  if (iVar3 == 0x130) {
    pCVar4 = parser->compiler_state->allocator;
    iVar3 = parser->ls->lastline;
    ptr_00 = (undefined4 *)(*pCVar4->calloc)(pCVar4->arena,1,0x50);
    *ptr_00 = 0xf;
    ptr_00[1] = iVar3;
    *(byte *)(ptr_00 + 6) = *(byte *)(ptr_00 + 6) & 0xfe;
    ptr_00[2] = 0x101;
    *(undefined8 *)(ptr_00 + 4) = 0;
    *(undefined8 *)(ptr_00 + 8) = 0;
    *(SemInfo *)(ptr_00 + 8) = (ls->t).seminfo;
    raviX_ptrlist_add((PtrList **)self,ptr_00,parser->compiler_state->allocator);
    raviX_next(ls);
  }
  else if (iVar3 == 0x7b) {
    ptr = parse_table_constructor(parser);
    raviX_ptrlist_add((PtrList **)self,ptr,parser->compiler_state->allocator);
  }
  else if (iVar3 == 0x28) {
    raviX_next(ls);
    if ((ls->t).token != 0x29) {
      parse_expression_list(parser,self);
      set_multireturn((ParserState *)*self,(AstNodeList *)0x0,in_table_constructor);
    }
    check_match(ls,0x29,0x28,line);
  }
  else {
    raviX_syntaxerror(ls,"function arguments expected");
  }
  return pAVar5;
}

Assistant:

static AstNode *parse_function_call(ParserState *parser, const StringObject *methodname,
					    int line)
{
	LexerState *ls = parser->ls;
	AstNode *call_expr = allocate_expr_ast_node(parser, EXPR_FUNCTION_CALL);
	call_expr->function_call_expr.method_name = methodname;
	call_expr->function_call_expr.arg_list = NULL;
	call_expr->function_call_expr.num_results = 1; /* By default we expect one arg */
	set_type(&call_expr->function_call_expr.type, RAVI_TANY);
	switch (ls->t.token) {
	case '(': { /* funcargs -> '(' [ explist ] ')' */
		raviX_next(ls);
		if (ls->t.token == ')') /* arg list is empty? */
			;
		else {
			parse_expression_list(parser, &call_expr->function_call_expr.arg_list);
			set_multireturn(parser, call_expr->function_call_expr.arg_list, false);
		}
		check_match(ls, ')', '(', line);
		break;
	}
	case '{': { /* funcargs -> constructor */
		AstNode *table_expr = parse_table_constructor(parser);
		add_ast_node(parser->compiler_state, &call_expr->function_call_expr.arg_list, table_expr);
		break;
	}
	case TOK_STRING: { /* funcargs -> STRING */
		AstNode *string_expr = new_literal_expression(parser, RAVI_TSTRING);
		string_expr->literal_expr.u.ts = ls->t.seminfo.ts;
		add_ast_node(parser->compiler_state, &call_expr->function_call_expr.arg_list, string_expr);
		raviX_next(ls);
		break;
	}
	default: {
		raviX_syntaxerror(ls, "function arguments expected");
	}
	}
	return call_expr;
}